

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O2

deUint32 deGetNumTotalLogicalCores(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x53);
  if (lVar1 < 2) {
    lVar1 = 1;
  }
  return (deUint32)lVar1;
}

Assistant:

deUint32 deGetNumTotalLogicalCores (void)
{
#if defined(_SC_NPROCESSORS_CONF)
	const long count = sysconf(_SC_NPROCESSORS_CONF);

	if (count <= 0)
		return 1;
	else
		return (deUint32)count;
#else
	return 1;
#endif
}